

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

uint pixel_dist_visible_only
               (AV1_COMP *cpi,MACROBLOCK *x,uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,
               BLOCK_SIZE tx_bsize,int txb_rows,int txb_cols,int visible_rows,int visible_cols)

{
  int iVar1;
  uint64_t uVar2;
  int in_ECX;
  uint8_t *in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  uint64_t sse64;
  MACROBLOCKD *xd;
  uint sse;
  uint in_stack_00000020;
  uint32_t local_38 [3];
  int h;
  int in_stack_ffffffffffffffd8;
  long lVar3;
  int a_stride;
  uint32_t local_4;
  
  if ((sse == in_stack_00000020) && ((int)dst == (int)src)) {
    (**(code **)(*in_RDI + (ulong)(byte)xd * 0x70 + 0xc918))(in_RDX,in_ECX,in_R8,in_R9D,local_38);
    local_4 = local_38[0];
  }
  else {
    lVar3 = in_RSI;
    iVar1 = is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
    h = (int)((ulong)in_R8 >> 0x20);
    a_stride = (int)((ulong)lVar3 >> 0x20);
    if (iVar1 == 0) {
      local_4 = aom_sse_odd_size((uint8_t *)in_RDI,a_stride,in_RDX,in_ECX,in_stack_ffffffffffffffd8,
                                 h);
    }
    else {
      uVar2 = aom_highbd_sse_odd_size
                        ((uint8_t *)in_RDI,a_stride,in_RDX,in_ECX,in_stack_ffffffffffffffd8,h);
      local_4 = (uint32_t)
                (uVar2 + (long)((1 << (((char)*(undefined4 *)(in_RSI + 0x2b40) + -8) * '\x02' &
                                      0x1fU)) >> 1) >>
                (((char)*(undefined4 *)(in_RSI + 0x2b40) + -8) * '\x02' & 0x3fU));
    }
  }
  return local_4;
}

Assistant:

static unsigned pixel_dist_visible_only(
    const AV1_COMP *const cpi, const MACROBLOCK *x, const uint8_t *src,
    const int src_stride, const uint8_t *dst, const int dst_stride,
    const BLOCK_SIZE tx_bsize, int txb_rows, int txb_cols, int visible_rows,
    int visible_cols) {
  unsigned sse;

  if (txb_rows == visible_rows && txb_cols == visible_cols) {
    cpi->ppi->fn_ptr[tx_bsize].vf(src, src_stride, dst, dst_stride, &sse);
    return sse;
  }

#if CONFIG_AV1_HIGHBITDEPTH
  const MACROBLOCKD *xd = &x->e_mbd;
  if (is_cur_buf_hbd(xd)) {
    uint64_t sse64 = aom_highbd_sse_odd_size(src, src_stride, dst, dst_stride,
                                             visible_cols, visible_rows);
    return (unsigned int)ROUND_POWER_OF_TWO(sse64, (xd->bd - 8) * 2);
  }
#else
  (void)x;
#endif
  sse = aom_sse_odd_size(src, src_stride, dst, dst_stride, visible_cols,
                         visible_rows);
  return sse;
}